

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

String * Corrade::Utility::Path::join
                   (String *__return_storage_ptr__,StringView path,StringView filename)

{
  bool bVar1;
  StringView view;
  initializer_list<Corrade::Containers::BasicStringView<const_char>_> view_00;
  BasicStringView<const_char> local_98;
  StringView local_88;
  BasicStringView<const_char> local_78;
  BasicStringView<const_char> local_68;
  char *local_58;
  size_t sStack_50;
  StringIterable local_40;
  
  local_98._sizePlusFlags = filename._sizePlusFlags;
  local_98._data = filename._data;
  local_88 = path;
  if ((((undefined1  [16])path & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0 ||
       path._data == (char *)0x0) ||
     (bVar1 = Containers::BasicStringView<const_char>::hasPrefix(&local_98,'/'), bVar1)) {
    view._sizePlusFlags = local_98._sizePlusFlags;
    view._data = local_98._data;
    Containers::String::String(__return_storage_ptr__,view);
  }
  else {
    bVar1 = Containers::BasicStringView<const_char>::hasSuffix(&local_88,'/');
    if (bVar1) {
      local_88 = Containers::BasicStringView<const_char>::slice
                           (&local_88,0,(local_88._sizePlusFlags & 0x3fffffffffffffff) - 1);
    }
    local_78._data = "/";
    local_78._sizePlusFlags = 0xc000000000000001;
    local_68._data = local_88._data;
    local_68._sizePlusFlags = local_88._sizePlusFlags;
    local_58 = local_98._data;
    sStack_50 = local_98._sizePlusFlags;
    view_00._M_len = 2;
    view_00._M_array = &local_68;
    Containers::StringIterable::StringIterable(&local_40,view_00);
    Containers::BasicStringView<const_char>::join(__return_storage_ptr__,&local_78,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Containers::String join(Containers::StringView path, const Containers::StringView filename) {
    if(
        /* Empty path */
        !path ||

        /* Absolute filename */
        filename.hasPrefix('/')

        #ifdef CORRADE_TARGET_WINDOWS
        /* Absolute filename on Windows */
        || (filename.size() > 2 && filename[1] == ':' && filename[2] == '/')
        #endif
    )
        return filename;

    /* Join with a slash in between. If it's already there, slice it away first
       so we have uniform handling. */
    if(path.hasSuffix('/')) path = path.exceptSuffix(1);
    return "/"_s.join({path, filename});
}